

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor.cpp
# Opt level: O2

void __thiscall Cryptor::show_statistics(Cryptor *this)

{
  string *psVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  string s2;
  string s;
  stringstream ss;
  bitset<8UL> local_220;
  long local_218;
  long local_210;
  undefined1 *local_1f8;
  long local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  string local_1b8 [16];
  basic_ostream<char,_std::char_traits<char>_> local_1a8 [376];
  
  local_1d8 = local_1c8;
  local_1d0 = 0;
  local_1c8[0] = 0;
  local_1f8 = local_1e8;
  local_1f0 = 0;
  local_1e8[0] = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,"---------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"input message: ");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout," ");
  psVar1 = &this->in_message_;
  std::__cxx11::string::string(local_1b8,(string *)psVar1);
  poVar3 = std::operator<<(poVar3,local_1b8);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::string(local_1b8,(string *)psVar1);
  lVar4 = std::__cxx11::string::find_first_not_of((char *)local_1b8,0x10b15e);
  std::__cxx11::string::~string(local_1b8);
  if (lVar4 != -1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"or binary: ");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__cxx11::string::string((string *)&local_218,(string *)psVar1);
    lVar2 = local_210;
    lVar4 = local_218;
    for (lVar5 = 0; lVar2 != lVar5; lVar5 = lVar5 + 1) {
      local_220.super__Base_bitset<1UL>._M_w._1_7_ = 0;
      local_220.super__Base_bitset<1UL>._M_w._0_1_ = *(byte *)(lVar4 + lVar5);
      std::operator<<(local_1a8,&local_220);
      std::ostream::flush();
    }
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    poVar3 = std::operator<<((ostream *)&std::cout," ");
    poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<((ostream *)&std::cout,"output: ");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout," ");
  psVar1 = &this->out_message_;
  std::__cxx11::string::string(local_1b8,(string *)psVar1);
  poVar3 = std::operator<<(poVar3,local_1b8);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::string(local_1b8,(string *)psVar1);
  lVar4 = std::__cxx11::string::find_first_not_of((char *)local_1b8,0x10b15e);
  std::__cxx11::string::~string(local_1b8);
  if (lVar4 == -1) {
    std::__cxx11::string::string(local_1b8,(string *)psVar1);
    std::__cxx11::string::operator=((string *)&local_1f8,local_1b8);
    std::__cxx11::string::~string(local_1b8);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"or binary: ");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__cxx11::string::string((string *)&local_218,(string *)psVar1);
    for (lVar4 = 0; local_210 != lVar4; lVar4 = lVar4 + 1) {
      local_220.super__Base_bitset<1UL>._M_w._1_7_ = 0;
      local_220.super__Base_bitset<1UL>._M_w._0_1_ = *(byte *)(local_218 + lVar4);
      std::operator<<(local_1a8,&local_220);
      std::ostream::flush();
    }
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_1f8,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    poVar3 = std::operator<<((ostream *)&std::cout," ");
    poVar3 = std::operator<<(poVar3,(string *)&local_1f8);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"---------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar2 = local_1d0;
  lVar4 = local_1f0;
  if (this->show_ == true) {
    std::operator<<((ostream *)&std::cout,"compression: ");
    lVar4 = lVar2 - lVar4;
    auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar7._0_8_ = lVar4;
    auVar7._12_4_ = 0x45300000;
    auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar6._0_8_ = lVar2;
    auVar6._12_4_ = 0x45300000;
    poVar3 = std::ostream::_M_insert<double>
                       ((((auVar7._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * 100.0) /
                        ((auVar6._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)));
    poVar3 = std::operator<<(poVar3,"%");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"---------------");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  return;
}

Assistant:

void Cryptor::show_statistics() {
  string s;
  string s2;
  cout << "---------------" << endl;
  cout << "input message: " << endl;
  cout << " " << get_in_message() << endl;
  if (get_in_message().find_first_not_of("01") != string::npos) {
    cout << "or binary: " << endl;
    stringstream ss;
    for (auto i : get_in_message()) {
      ss << bitset<8>(static_cast<unsigned long long int>(i)) << flush;
    }
    s = ss.str();
    cout << " " << s << endl;
  }
  cout << endl;

  cout << "output: " << endl;
  cout << " " << get_out_message() << endl;
  if (get_out_message().find_first_not_of("01") != string::npos) {
    cout << "or binary: " << endl;
    stringstream ss2;
    for (auto i : get_out_message()) {
      ss2 << bitset<8>(static_cast<unsigned long long int>(i)) << flush;
    }
    s2 = ss2.str();
    cout << " " << s2 << endl;
  }
  else {
    s2 = get_out_message();
  }
  cout << "---------------" << endl;

  if (show_) {
    const auto diff = s.size() - s2.size();
    const auto compression = (diff * 100.0) / s.size();
    cout << "compression: " << compression << "%" << endl;
    cout << "---------------" << endl;
  }
}